

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool upb_strtable_insert(upb_strtable *t,char *k,size_t len,upb_value v,upb_Arena *a)

{
  _Bool _Var1;
  byte bVar2;
  uint32_t hash_00;
  upb_key tabkey;
  lookupkey_t key_00;
  uint32_t hash;
  upb_key key;
  lookupkey_t lookupkey;
  upb_SizePrefixString *size_prefix_string;
  upb_StringView sv;
  upb_Arena *a_local;
  size_t len_local;
  char *k_local;
  upb_strtable *t_local;
  upb_value v_local;
  
  _Var1 = isfull(&t->t);
  if (_Var1) {
    bVar2 = _upb_log2_table_size(&t->t);
    _Var1 = upb_strtable_resize(t,(long)(int)(bVar2 + 1),a);
    if (!_Var1) {
      return false;
    }
  }
  key_00.str = upb_StringView_FromDataAndSize(k,len);
  tabkey.str = upb_SizePrefixString_Copy(key_00.str,a);
  if (tabkey.num != 0) {
    hash_00 = _upb_Hash_NoSeed(k,len);
    insert(&t->t,key_00,tabkey,v,hash_00,strhash,streql);
  }
  return tabkey.num != 0;
}

Assistant:

bool upb_strtable_insert(upb_strtable* t, const char* k, size_t len,
                         upb_value v, upb_Arena* a) {
  if (isfull(&t->t)) {
    /* Need to resize.  New table of double the size, add old elements to it. */
    if (!upb_strtable_resize(t, _upb_log2_table_size(&t->t) + 1, a)) {
      return false;
    }
  }

  upb_StringView sv = upb_StringView_FromDataAndSize(k, len);
  upb_SizePrefixString* size_prefix_string = upb_SizePrefixString_Copy(sv, a);
  if (!size_prefix_string) return false;

  lookupkey_t lookupkey = {.str = sv};
  upb_key key = {.str = size_prefix_string};
  uint32_t hash = _upb_Hash_NoSeed(k, len);
  insert(&t->t, lookupkey, key, v, hash, &strhash, &streql);
  return true;
}